

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftrl.cc
# Opt level: O0

void update_state_and_predict_cb(ftrl *b,single_learner *param_2,example *ec)

{
  example *in_RDX;
  vw *in_RSI;
  long *in_RDI;
  float fVar1;
  
  *(undefined4 *)((long)in_RDI + 0x24) = 0;
  *(undefined4 *)(in_RDI + 5) = 0;
  GD::foreach_feature<update_data,_&inner_update_cb_state_and_predict>
            (in_RSI,in_RDX,(update_data *)0x2db2b6);
  *(double *)(*in_RDI + 0xd0) =
       (double)in_RDX->weight * (double)*(float *)(in_RDI + 5) + *(double *)(*in_RDI + 0xd0);
  in_RDI[8] = (long)((double)in_RDX->weight + (double)in_RDI[8]);
  in_RDX->partial_prediction =
       *(float *)((long)in_RDI + 0x24) /
       (float)((*(double *)(*in_RDI + 0xd0) + 1e-06) / (double)in_RDI[8]);
  fVar1 = GD::finalize_prediction((shared_data *)in_RDX,0.0);
  (in_RDX->pred).scalar = fVar1;
  return;
}

Assistant:

void update_state_and_predict_cb(ftrl& b, single_learner&, example& ec)
{
  b.data.predict = 0;
  b.data.normalized_squared_norm_x = 0;

  GD::foreach_feature<update_data, inner_update_cb_state_and_predict>(*b.all, ec, b.data);

  b.all->normalized_sum_norm_x += ((double)ec.weight) * b.data.normalized_squared_norm_x;
  b.total_weight += ec.weight;

  ec.partial_prediction = b.data.predict/((float)((b.all->normalized_sum_norm_x + 1e-6)/b.total_weight));

  ec.pred.scalar = GD::finalize_prediction(b.all->sd, ec.partial_prediction);
}